

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O1

timeval __thiscall hrgls::Message::TimeStamp(Message *this)

{
  timeval tVar1;
  hrgls_Status hVar2;
  Message_private *pMVar3;
  timeval ret;
  __time_t local_18;
  __suseconds_t _Stack_10;
  
  local_18 = 0;
  _Stack_10 = 0;
  pMVar3 = this->m_private;
  if (pMVar3->Message == (hrgls_Message)0x0) {
    hVar2 = 0x3ee;
  }
  else {
    hVar2 = hrgls_MessageGetTimeStamp(pMVar3->Message,&local_18);
    pMVar3 = this->m_private;
  }
  pMVar3->status = hVar2;
  tVar1.tv_usec = _Stack_10;
  tVar1.tv_sec = local_18;
  return tVar1;
}

Assistant:

struct timeval Message::TimeStamp() const
  {
	  struct timeval ret = {};
	  if (!m_private->Message) {
		  m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
		  return ret;
	  }
	  m_private->status = hrgls_MessageGetTimeStamp(m_private->Message, &ret);
	  return ret;
  }